

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataDictionary.h
# Opt level: O2

bool __thiscall FIX::DataDictionary::isFieldValue(DataDictionary *this,int field,string *value)

{
  bool bVar1;
  const_iterator cVar2;
  long lVar3;
  const_iterator cVar4;
  int field_local;
  _Base_ptr *local_58;
  string singleValue;
  
  field_local = field;
  cVar2 = std::
          _Rb_tree<int,_std::pair<const_int,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_int,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
          ::find((_Rb_tree<int,_std::pair<const_int,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_int,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                  *)(this + 0x1f0),&field_local);
  if (cVar2._M_node == (_Base_ptr)(this + 0x1f8)) {
    bVar1 = false;
  }
  else {
    bVar1 = isMultipleValueField(this,field_local);
    local_58 = &cVar2._M_node[1]._M_parent;
    if (bVar1) {
      do {
        lVar3 = std::__cxx11::string::find((char)value,0x20);
        std::__cxx11::string::substr((ulong)&singleValue,(ulong)value);
        cVar4 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_58,&singleValue);
        std::__cxx11::string::~string((string *)&singleValue);
        if (lVar3 == -1) break;
      } while (cVar4._M_node != (_Base_ptr)&cVar2._M_node[1]._M_left);
      bVar1 = cVar4._M_node == (_Base_ptr)&cVar2._M_node[1]._M_left;
    }
    else {
      cVar4 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_58,value);
      bVar1 = cVar4._M_node == (_Base_ptr)&cVar2._M_node[1]._M_left;
    }
    bVar1 = !bVar1;
  }
  return bVar1;
}

Assistant:

bool isFieldValue(int field, const std::string &value) const {
    FieldToValue::const_iterator i = m_fieldValues.find(field);
    if (i == m_fieldValues.end()) {
      return false;
    }
    if (!isMultipleValueField(field)) {
      return i->second.find(value) != i->second.end();
    }

    // MultipleValue
    std::string::size_type startPos = 0;
    std::string::size_type endPos = 0;
    do {
      endPos = value.find_first_of(' ', startPos);
      std::string singleValue = value.substr(startPos, endPos - startPos);
      if (i->second.find(singleValue) == i->second.end()) {
        return false;
      }
      startPos = endPos + 1;
    } while (endPos != std::string::npos);
    return true;
  }